

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue len_val;
  JSValue v_03;
  JSValue obj_00;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion *pJVar4;
  int in_ECX;
  JSValueUnion in_RDI;
  long in_R8;
  JSValue JVar5;
  int res;
  int i;
  int64_t n;
  int64_t k;
  int64_t len;
  JSValue e;
  JSValue val;
  JSValue arr;
  JSValue obj;
  JSValue v;
  JSAtom in_stack_fffffffffffffe4c;
  JSValueUnion in_stack_fffffffffffffe50;
  JSValueUnion in_stack_fffffffffffffe58;
  int64_t in_stack_fffffffffffffe60;
  int64_t *in_stack_fffffffffffffe68;
  JSContext *in_stack_fffffffffffffe70;
  JSValue in_stack_fffffffffffffe78;
  JSValue in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe98 [16];
  long idx;
  JSContext *ctx_00;
  JSValueUnion JVar6;
  JSValueUnion local_138;
  void *local_130;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int64_t in_stack_fffffffffffffef0;
  long lVar7;
  long lVar8;
  long local_108;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  JSValueUnion in_stack_ffffffffffffff08;
  JSValueUnion JVar9;
  int64_t in_stack_ffffffffffffff10;
  void *pvVar10;
  JSValueUnion in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  int32_t local_90;
  undefined4 uStack_8c;
  int64_t local_88;
  uint uStack_6c;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar5.u._4_4_ = in_stack_fffffffffffffeec;
  JVar5.u.int32 = in_stack_fffffffffffffee8;
  JVar5.tag = in_stack_fffffffffffffef0;
  JVar5 = JS_ToObject((JSContext *)0x3,JVar5);
  local_138 = JVar5.u;
  local_130 = (void *)JVar5.tag;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    idx = (ulong)uStack_6c << 0x20;
    ctx_00 = (JSContext *)0x0;
    obj_00.tag = in_stack_ffffffffffffff20;
    obj_00.u.float64 = in_stack_ffffffffffffff18.float64;
    len_val.tag = in_stack_ffffffffffffff10;
    len_val.u.float64 = in_stack_ffffffffffffff08.float64;
    JVar5 = JS_ArraySpeciesCreate
                      ((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       obj_00,len_val);
    JVar6 = JVar5.u;
    local_88 = JVar5.tag;
    iVar2 = JS_IsException(JVar5);
    if (iVar2 == 0) {
      lVar7 = 0;
      for (iVar2 = -1; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
        JVar9 = local_138;
        pvVar10 = local_130;
        if (-1 < iVar2) {
          pJVar4 = (JSValueUnion *)(in_R8 + (long)iVar2 * 0x10);
          JVar9.ptr = pJVar4->ptr;
          pvVar10 = pJVar4[1].ptr;
        }
        iVar3 = JS_isConcatSpreadable(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
        if (iVar3 < 0) goto LAB_001ad225;
        if (iVar3 == 0) {
          if (0x1ffffffffffffe < lVar7) {
            JS_ThrowTypeError((JSContext *)in_RDI.ptr,"Array loo long");
            goto LAB_001ad225;
          }
          v_03.tag = (int64_t)pvVar10;
          v_03.u.float64 = JVar9.float64;
          in_stack_fffffffffffffe58 = in_RDI;
          lVar8 = lVar7;
          in_stack_fffffffffffffe78 = JS_DupValue((JSContext *)in_RDI.ptr,v_03);
          iVar3 = JS_DefinePropertyValueInt64
                            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe88,
                             (int64_t)in_stack_fffffffffffffe68,in_stack_fffffffffffffe78,
                             in_stack_ffffffffffffff00);
          in_stack_fffffffffffffe60 = lVar7;
          if (iVar3 < 0) goto LAB_001ad225;
          lVar7 = lVar8 + 1;
        }
        else {
          iVar3 = js_get_length64(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                                  in_stack_fffffffffffffe78);
          if (iVar3 != 0) goto LAB_001ad225;
          if (0x1fffffffffffff <
              lVar7 + CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)) {
            JS_ThrowTypeError((JSContext *)in_RDI.ptr,"Array loo long");
            goto LAB_001ad225;
          }
          for (local_108 = 0;
              local_108 < CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
              local_108 = local_108 + 1) {
            iVar3 = JS_TryGetPropertyInt64(ctx_00,JVar5,idx,in_stack_fffffffffffffe98._8_8_);
            if ((iVar3 < 0) ||
               ((iVar3 != 0 &&
                (iVar3 = JS_DefinePropertyValueInt64
                                   (in_stack_fffffffffffffe70,in_stack_fffffffffffffe88,
                                    (int64_t)in_stack_fffffffffffffe68,in_stack_fffffffffffffe78,
                                    in_stack_ffffffffffffff00), iVar3 < 0)))) goto LAB_001ad225;
            lVar7 = lVar7 + 1;
          }
        }
      }
      if (lVar7 == (int)lVar7) {
        local_30._4_4_ = uStack_c;
        local_30.int32 = (int)lVar7;
        local_28 = 0;
        in_stack_fffffffffffffe50 = in_RDI;
      }
      else {
        JVar5 = __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)lVar7);
        local_60 = JVar5.u;
        local_30 = local_60;
        local_58 = JVar5.tag;
        local_28 = local_58;
        in_stack_fffffffffffffe50 = in_RDI;
      }
      this_obj.tag = local_28;
      this_obj.u.float64 = local_30.float64;
      val_00.tag = in_stack_fffffffffffffe60;
      val_00.u.ptr = in_stack_fffffffffffffe58.ptr;
      iVar2 = JS_SetProperty((JSContext *)in_stack_fffffffffffffe50.ptr,this_obj,
                             in_stack_fffffffffffffe4c,val_00);
      if (-1 < iVar2) {
        v_00.tag = in_stack_fffffffffffffe60;
        v_00.u.ptr = in_stack_fffffffffffffe58.ptr;
        JS_FreeValue((JSContext *)in_stack_fffffffffffffe50.ptr,v_00);
        local_90 = JVar6.int32;
        uStack_8c = JVar6._4_4_;
        goto LAB_001ad276;
      }
    }
  }
LAB_001ad225:
  v_01.tag = in_stack_fffffffffffffe60;
  v_01.u.ptr = in_stack_fffffffffffffe58.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffe50.ptr,v_01);
  v_02.tag = in_stack_fffffffffffffe60;
  v_02.u.ptr = in_stack_fffffffffffffe58.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffe50.ptr,v_02);
  local_90 = 0;
  local_88 = 6;
LAB_001ad276:
  JVar1.u._4_4_ = uStack_8c;
  JVar1.u.int32 = local_90;
  JVar1.tag = local_88;
  return JVar1;
}

Assistant:

static JSValue js_array_concat(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue obj, arr, val;
    JSValueConst e;
    int64_t len, k, n;
    int i, res;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;

    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    n = 0;
    for (i = -1; i < argc; i++) {
        if (i < 0)
            e = obj;
        else
            e = argv[i];

        res = JS_isConcatSpreadable(ctx, e);
        if (res < 0)
            goto exception;
        if (res) {
            if (js_get_length64(ctx, &len, e))
                goto exception;
            if (n + len > MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            for (k = 0; k < len; k++, n++) {
                res = JS_TryGetPropertyInt64(ctx, e, k, &val);
                if (res < 0)
                    goto exception;
                if (res) {
                    if (JS_DefinePropertyValueInt64(ctx, arr, n, val,
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
            }
        } else {
            if (n >= MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, arr, n, JS_DupValue(ctx, e),
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            n++;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}